

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

int cimg_library::cimg::fclose(FILE *__stream)

{
  uint uVar1;
  int errn;
  
  if (__stream == (FILE *)0x0) {
    warn("cimg::fclose() : Specified file is (null).");
  }
  else if ((__stream != _stdin) && (__stream != _stdout)) {
    uVar1 = ::fclose(__stream);
    if (uVar1 == 0) {
      return 0;
    }
    warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar1);
    return uVar1;
  }
  return 0;
}

Assistant:

inline int fclose(std::FILE *file) {
      if (!file) warn("cimg::fclose() : Specified file is (null).");
      if (!file || file==stdin || file==stdout) return 0;
      const int errn = std::fclose(file);
      if (errn!=0) warn("cimg::fclose() : Error code %d returned during file closing.",
                        errn);
      return errn;
    }